

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGenerators::Join
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lst,char separator)

{
  pointer pbVar1;
  long *plVar2;
  undefined7 in_register_00000009;
  long *plVar3;
  pointer __rhs;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __rhs = (lst->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (lst->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (__rhs == pbVar1) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"","",CONCAT71(in_register_00000009,separator));
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    do {
      std::operator+(&local_50,".",__rhs);
      plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&local_50,local_50._M_string_length,0,'\x01');
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_60 = *plVar3;
        lStack_58 = plVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar3;
        local_70 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != (lst->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::_M_erase
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::Join(const std::vector<std::string>& lst,
                              char separator)
{
    if (lst.empty())
      {
      return "";
      }

    std::string result;
    for (std::vector<std::string>::const_iterator it = lst.begin();
         it != lst.end();
         ++it)
      {
      result += "." + (*it) + separator;
      }
    result.erase(result.end() - 1);
    return result;
}